

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::Formatter::Set<google::protobuf::strings::Hex>
          (Formatter *this,string *key,Hex *value)

{
  undefined8 uVar1;
  undefined4 uVar2;
  mapped_type *this_00;
  Hex hex;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  AlphaNum local_50;
  
  uVar1 = value->value;
  uVar2 = value->spec;
  hex.spec = uVar2;
  hex.value = uVar1;
  hex._12_4_ = 0;
  strings::AlphaNum::AlphaNum(&local_50,hex);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,local_50.piece_data_,local_50.piece_data_ + local_50.piece_size_);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->vars_,key);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void Set(const std::string& key, const T& value) {
    vars_[key] = ToString(value);
  }